

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O3

uint64_t farmhash64_na(char *s,size_t len)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  uint64_t uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  
  if (0x20 < len) {
    if (len < 0x41) {
      lVar10 = len * 2 + -0x651e95c4d06fbfb1;
      lVar6 = *(long *)s * -0x651e95c4d06fbfb1;
      uVar5 = *(long *)(s + (len - 8)) * lVar10;
      uVar13 = lVar6 + *(long *)(s + 8);
      uVar18 = *(long *)(s + 8) + 0x9ae16a3b2f90404f;
      uVar4 = lVar6 + *(long *)(s + 0x18);
      uVar19 = (uVar5 >> 0x1e | uVar5 << 0x22) + (uVar13 >> 0x2b | uVar13 * 0x200000) +
               *(long *)(s + (len - 0x10)) * -0x651e95c4d06fbfb1;
      uVar5 = (uVar18 >> 0x12 | uVar18 << 0x2e) + lVar6 + uVar5;
      uVar13 = (uVar19 ^ uVar5) * lVar10;
      uVar18 = (uVar19 + *(long *)(s + (len - 0x20))) * lVar10;
      uVar5 = (uVar13 >> 0x2f ^ uVar5 ^ uVar13) * lVar10;
      uVar4 = (uVar4 >> 0x12 | uVar4 << 0x2e) + *(long *)(s + 0x10) * lVar10 + uVar18;
      uVar13 = *(long *)(s + 0x10) * lVar10 + *(long *)(s + 0x18);
      uVar13 = ((uVar18 >> 0x1e | uVar18 << 0x22) + (uVar13 >> 0x2b | uVar13 * 0x200000) +
                ((uVar5 >> 0x2f ^ uVar5) * lVar10 + *(long *)(s + (len - 0x18))) * lVar10 ^ uVar4) *
               lVar10;
      uVar13 = (uVar13 >> 0x2f ^ uVar4 ^ uVar13) * lVar10;
      uVar7 = (uVar13 >> 0x2f ^ uVar13) * lVar10;
    }
    else {
      lVar14 = *(long *)s + 0x1529cba0ca458ff;
      lVar16 = 0x226bb95b4e64b6d4;
      uVar5 = 0x134a747f856d0526;
      uVar19 = 0;
      lVar6 = 0;
      uVar4 = 0;
      lVar20 = 0;
      lVar10 = 0;
      uVar13 = len - 1 & 0xffffffffffffffc0;
      uVar18 = (ulong)((uint)(len - 1) & 0x3f);
      do {
        lVar1 = uVar19 + 0x28;
        lVar11 = uVar19 + 0x10;
        lVar2 = uVar19 + 0x30;
        lVar9 = lVar10 * -0x4b6d499041670d8d + *(long *)(s + uVar19);
        uVar15 = lVar14 + lVar20 + lVar16 + *(long *)(s + uVar19 + 8);
        uVar17 = lVar16 + lVar10 + *(long *)(s + lVar2);
        uVar12 = *(long *)(s + uVar19 + 8) + lVar9 + *(long *)(s + lVar11);
        lVar3 = uVar19 + 0x38;
        lVar14 = (uVar5 + lVar6 >> 0x21 | (uVar5 + lVar6) * 0x80000000) * -0x4b6d499041670d8d;
        lVar16 = lVar20 + *(long *)(s + lVar1) +
                 (uVar17 >> 0x2a | uVar17 * 0x400000) * -0x4b6d499041670d8d;
        lVar10 = uVar19 + 0x18;
        uVar5 = (uVar15 >> 0x25 | uVar15 * 0x8000000) * -0x4b6d499041670d8d ^ uVar4;
        lVar8 = uVar4 + lVar14 + *(long *)(s + uVar19 + 0x20);
        uVar19 = uVar19 + 0x40;
        lVar20 = uVar12 + *(long *)(s + lVar10);
        uVar15 = lVar6 + lVar9 + *(long *)(s + lVar10) + uVar5;
        uVar4 = *(long *)(s + lVar1) + *(long *)(s + lVar2) + lVar8;
        lVar10 = lVar9 + (uVar12 >> 0x2c | uVar12 * 0x100000) + (uVar15 >> 0x15 | uVar15 << 0x2b);
        lVar6 = uVar4 + *(long *)(s + lVar3);
        uVar12 = *(long *)(s + lVar11) + lVar8 + lVar16 + *(long *)(s + lVar3);
        uVar4 = lVar8 + (uVar4 >> 0x2c | uVar4 * 0x100000) + (uVar12 >> 0x15 | uVar12 << 0x2b);
      } while (uVar13 != uVar19);
      lVar1 = (uVar5 & 0xff) * 2 + -0x4b6d499041670d8d;
      lVar11 = lVar10 * lVar1 + *(long *)(s + uVar18 + (uVar13 - 0x3f));
      lVar20 = lVar20 + lVar6 + uVar18;
      lVar6 = lVar6 + uVar18 + lVar20;
      uVar5 = uVar5 + lVar6;
      uVar15 = lVar16 + lVar10 + *(long *)(s + uVar18 + (uVar13 - 0xf));
      uVar19 = lVar14 + lVar16 + *(long *)(s + uVar18 + (uVar13 - 0x37)) + lVar20;
      uVar17 = *(long *)(s + uVar18 + (uVar13 - 0x37)) + *(long *)(s + uVar18 + (uVar13 - 0x2f)) +
               lVar11;
      uVar5 = uVar5 >> 0x21 | uVar5 * 0x80000000;
      uVar12 = uVar4 * 9 ^ (uVar19 >> 0x25 | uVar19 * 0x8000000) * lVar1;
      uVar15 = lVar20 * 9 + *(long *)(s + uVar18 + (uVar13 - 0x17)) +
               (uVar15 >> 0x2a | uVar15 * 0x400000) * lVar1;
      uVar19 = lVar6 + lVar11 + uVar12 + *(long *)(s + uVar18 + (uVar13 - 0x27));
      lVar10 = uVar5 * lVar1 + uVar4 + *(long *)(s + uVar18 + (uVar13 - 0x1f));
      uVar21 = *(long *)(s + uVar18 + (uVar13 - 0x17)) + *(long *)(s + uVar18 + (uVar13 - 0xf)) +
               lVar10;
      uVar4 = *(long *)(s + uVar18 + (uVar13 - 0x2f)) + uVar15 +
              *(long *)(s + uVar18 + (uVar13 - 7)) + lVar10;
      uVar22 = uVar21 + *(long *)(s + uVar18 + (uVar13 - 7));
      uVar4 = (uVar21 >> 0x2c | uVar21 * 0x100000) + lVar10 + (uVar4 >> 0x15 | uVar4 << 0x2b);
      uVar13 = (uVar17 + *(long *)(s + uVar18 + (uVar13 - 0x27)) ^ uVar22) * lVar1;
      uVar18 = ((uVar17 >> 0x2c | uVar17 * 0x100000) + lVar11 + (uVar19 >> 0x15 | uVar19 << 0x2b) ^
               uVar4) * lVar1;
      uVar13 = (uVar13 >> 0x2f ^ uVar22 ^ uVar13) * lVar1;
      uVar13 = (uVar18 >> 0x2f ^ uVar4 ^ uVar18) * lVar1;
      uVar13 = ((uVar13 >> 0x2f ^ uVar13) + uVar5) * lVar1;
      uVar13 = ((uVar15 >> 0x2f ^ uVar15) * -0x3c5a37a36834ced9 + uVar12 +
                (uVar13 >> 0x2f ^ uVar13) * lVar1 ^ uVar13) * lVar1;
      uVar13 = (uVar13 >> 0x2f ^ uVar13 ^ uVar13) * lVar1;
      uVar7 = (uVar13 >> 0x2f ^ uVar13) * lVar1;
    }
    return uVar7;
  }
  if (len < 0x11) {
    if (len < 8) {
      if (len < 4) {
        if (len == 0) {
          return 0x9ae16a3b2f90404f;
        }
        uVar13 = ((ulong)(byte)s[len - 1] << 2 | len) * -0x3c5a37a36834ced9 ^
                 (ulong)CONCAT11(s[len >> 1],*s) * -0x651e95c4d06fbfb1;
        return (uVar13 >> 0x2f ^ uVar13) * -0x651e95c4d06fbfb1;
      }
      lVar10 = len * 2 + -0x651e95c4d06fbfb1;
      uVar13 = (len + (ulong)*(uint *)s * 8 ^ (ulong)*(uint *)(s + (len - 4))) * lVar10;
      uVar13 = (uVar13 >> 0x2f ^ *(uint *)(s + (len - 4)) ^ uVar13) * lVar10;
      uVar13 = uVar13 >> 0x2f ^ uVar13;
    }
    else {
      uVar13 = *(ulong *)(s + (len - 8));
      lVar10 = len * 2 + -0x651e95c4d06fbfb1;
      uVar4 = *(long *)s + 0x9ae16a3b2f90404f;
      uVar5 = ((uVar4 >> 0x19 | uVar4 << 0x27) + uVar13) * lVar10;
      uVar13 = ((uVar13 >> 0x25 | uVar13 << 0x1b) * lVar10 + uVar4 ^ uVar5) * lVar10;
      uVar13 = (uVar13 >> 0x2f ^ uVar5 ^ uVar13) * lVar10;
      uVar13 = uVar13 >> 0x2f ^ uVar13;
    }
  }
  else {
    lVar10 = len * 2 + -0x651e95c4d06fbfb1;
    uVar5 = *(long *)(s + (len - 8)) * lVar10;
    uVar13 = *(long *)s * -0x4b6d499041670d8d + *(long *)(s + 8);
    uVar4 = *(long *)(s + 8) + 0x9ae16a3b2f90404f;
    uVar4 = (uVar4 >> 0x12 | uVar4 << 0x2e) + *(long *)s * -0x4b6d499041670d8d + uVar5;
    uVar13 = ((uVar5 >> 0x1e | uVar5 << 0x22) + (uVar13 >> 0x2b | uVar13 * 0x200000) +
              *(long *)(s + (len - 0x10)) * -0x651e95c4d06fbfb1 ^ uVar4) * lVar10;
    uVar13 = (uVar13 >> 0x2f ^ uVar4 ^ uVar13) * lVar10;
    uVar13 = uVar13 >> 0x2f ^ uVar13;
  }
  return uVar13 * lVar10;
}

Assistant:

uint64_t farmhash64_na(const char *s, size_t len) {
  const uint64_t seed = 81;
  if (len <= 32) {
    if (len <= 16) {
      return farmhash_na_len_0_to_16(s, len);
    } else {
      return farmhash_na_len_17_to_32(s, len);
    }
  } else if (len <= 64) {
    return farmhash_na_len_33_to_64(s, len);
  }

  // For strings over 64 bytes we loop.  Internal state consists of
  // 56 bytes: v, w, x, y, and z.
  uint64_t x = seed;
  uint64_t y = seed * k1 + 113;
  uint64_t z = smix(y * k2 + 113) * k2;
  uint128_c_t v = make_uint128_c_t(0, 0);
  uint128_c_t w = make_uint128_c_t(0, 0);
  x = x * k2 + fetch64(s);

  // Set end so that after the loop we have 1 to 64 bytes left to process.
  const char* end = s + ((len - 1) / 64) * 64;
  const char* last64 = end + ((len - 1) & 63) - 63;
  assert(s + len - 64 == last64);
  do {
    x = ror64(x + y + v.a + fetch64(s + 8), 37) * k1;
    y = ror64(y + v.b + fetch64(s + 48), 42) * k1;
    x ^= w.b;
    y += v.a + fetch64(s + 40);
    z = ror64(z + w.a, 33) * k1;
    v = weak_farmhash_na_len_32_with_seeds(s, v.b * k1, x + w.a);
    w = weak_farmhash_na_len_32_with_seeds(s + 32, z + w.b, y + fetch64(s + 16));
    swap64(&z, &x);
    s += 64;
  } while (s != end);
  uint64_t mul = k1 + ((z & 0xff) << 1);
  // Make s point to the last 64 bytes of input.
  s = last64;
  w.a += ((len - 1) & 63);
  v.a += w.a;
  w.a += v.a;
  x = ror64(x + y + v.a + fetch64(s + 8), 37) * mul;
  y = ror64(y + v.b + fetch64(s + 48), 42) * mul;
  x ^= w.b * 9;
  y += v.a * 9 + fetch64(s + 40);
  z = ror64(z + w.a, 33) * mul;
  v = weak_farmhash_na_len_32_with_seeds(s, v.b * mul, x + w.a);
  w = weak_farmhash_na_len_32_with_seeds(s + 32, z + w.b, y + fetch64(s + 16));
  swap64(&z, &x);
  return farmhash_len_16_mul(farmhash_len_16_mul(v.a, w.a, mul) + smix(y) * k0 + z,
                   farmhash_len_16_mul(v.b, w.b, mul) + x,
                   mul);
}